

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O3

bool __thiscall Func::IsStackArgsEnabled(Func *this)

{
  Func *this_00;
  bool bVar1;
  JITTimeFunctionBody *this_01;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar1 = JITTimeFunctionBody::UsesArgumentsObject(this_01);
  if (bVar1) {
    bVar1 = GetHasStackArgs(this);
    this_00 = this->topFunc;
    if (bVar1 && this_00 != (Func *)0x0) {
      bVar1 = GetHasStackArgs(this_00);
      return bVar1;
    }
    bVar1 = bVar1 && this_00 == (Func *)0x0;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool                IsStackArgsEnabled()
    {
                        Func* curFunc = this;
                        bool isStackArgsEnabled = GetJITFunctionBody()->UsesArgumentsObject() && curFunc->GetHasStackArgs();
                        Func * topFunc = curFunc->GetTopFunc();
                        if (topFunc != nullptr)
                        {
                            isStackArgsEnabled = isStackArgsEnabled && topFunc->GetHasStackArgs();
                        }
                        return isStackArgsEnabled;
    }